

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O0

int cbs_find_ber(CBS *orig_in,int *ber_found,uint32_t depth)

{
  int iVar1;
  size_t sVar2;
  int local_5c;
  size_t sStack_58;
  int indefinite;
  size_t header_len;
  undefined1 local_48 [4];
  CBS_ASN1_TAG tag;
  CBS contents;
  CBS in;
  uint32_t depth_local;
  int *ber_found_local;
  CBS *orig_in_local;
  
  if (depth < 0x81) {
    contents.len = (size_t)orig_in->data;
    *ber_found = 0;
    do {
      do {
        sVar2 = CBS_len((CBS *)&contents.len);
        if (sVar2 == 0) {
          return 1;
        }
        iVar1 = CBS_get_any_ber_asn1_element
                          ((CBS *)&contents.len,(CBS *)local_48,
                           (CBS_ASN1_TAG *)((long)&header_len + 4),&stack0xffffffffffffffa8,
                           ber_found,&local_5c);
        if (iVar1 == 0) {
          return 0;
        }
        if (*ber_found != 0) {
          return 1;
        }
      } while ((header_len._4_4_ & 0x20000000) == 0);
      iVar1 = is_string_type(header_len._4_4_);
      if (iVar1 != 0) {
        *ber_found = 1;
        return 1;
      }
      iVar1 = CBS_skip((CBS *)local_48,sStack_58);
      if ((iVar1 == 0) || (iVar1 = cbs_find_ber((CBS *)local_48,ber_found,depth + 1), iVar1 == 0)) {
        return 0;
      }
    } while (*ber_found == 0);
    orig_in_local._4_4_ = 1;
  }
  else {
    orig_in_local._4_4_ = 0;
  }
  return orig_in_local._4_4_;
}

Assistant:

static int cbs_find_ber(const CBS *orig_in, int *ber_found, uint32_t depth) {
  if (depth > kMaxDepth) {
    return 0;
  }

  CBS in = *orig_in;
  *ber_found = 0;

  while (CBS_len(&in) > 0) {
    CBS contents;
    CBS_ASN1_TAG tag;
    size_t header_len;
    int indefinite;
    if (!CBS_get_any_ber_asn1_element(&in, &contents, &tag, &header_len,
                                      ber_found, &indefinite)) {
      return 0;
    }
    if (*ber_found) {
      return 1;
    }
    if (tag & CBS_ASN1_CONSTRUCTED) {
      if (is_string_type(tag)) {
        // Constructed strings are only legal in BER and require conversion.
        *ber_found = 1;
        return 1;
      }
      if (!CBS_skip(&contents, header_len) ||
          !cbs_find_ber(&contents, ber_found, depth + 1)) {
        return 0;
      }
      if (*ber_found) {
        // We already found BER. No need to continue parsing.
        return 1;
      }
    }
  }

  return 1;
}